

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O0

void __thiscall ImVector<ImGuiStyleMod>::push_back(ImVector<ImGuiStyleMod> *this,ImGuiStyleMod *v)

{
  int iVar1;
  ImGuiStyleMod *pIVar2;
  undefined8 *in_RSI;
  ImVector<ImGuiStyleMod> *in_RDI;
  ImVector<ImGuiStyleMod> *unaff_retaddr;
  ImVector<ImGuiStyleMod> *pIVar3;
  
  if (in_RDI->Size == in_RDI->Capacity) {
    pIVar3 = in_RDI;
    _grow_capacity(in_RDI,in_RDI->Size + 1);
    reserve(unaff_retaddr,(int)((ulong)pIVar3 >> 0x20));
  }
  pIVar2 = in_RDI->Data;
  iVar1 = in_RDI->Size;
  *(undefined8 *)(pIVar2 + iVar1) = *in_RSI;
  pIVar2[iVar1].field_1.BackupInt[1] = *(int *)(in_RSI + 1);
  in_RDI->Size = in_RDI->Size + 1;
  return;
}

Assistant:

inline void         push_back(const T& v)               { if (Size == Capacity) reserve(_grow_capacity(Size + 1)); memcpy(&Data[Size], &v, sizeof(v)); Size++; }